

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O2

void gen_exception(TCGContext_conflict12 *tcg_ctx,int excp)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = tcg_const_i32_s390x(tcg_ctx,excp);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_exception,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_exception(TCGContext *tcg_ctx, int excp, uint32_t syndrome,
                                 uint32_t target_el)
{
    TCGv_i32 tcg_excp = tcg_const_i32(tcg_ctx, excp);
    TCGv_i32 tcg_syn = tcg_const_i32(tcg_ctx, syndrome);
    TCGv_i32 tcg_el = tcg_const_i32(tcg_ctx, target_el);

    gen_helper_exception_with_syndrome(tcg_ctx, tcg_ctx->cpu_env, tcg_excp,
                                       tcg_syn, tcg_el);

    tcg_temp_free_i32(tcg_ctx, tcg_el);
    tcg_temp_free_i32(tcg_ctx, tcg_syn);
    tcg_temp_free_i32(tcg_ctx, tcg_excp);
}